

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenCADFile.cpp
# Opt level: O0

void __thiscall GenCADFile::fill_signals_cache(GenCADFile *this)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  mpc_ast_t *pmVar4;
  GenCADFile *in_RDI;
  ComponentPin key;
  char *signal_name;
  char *node_pin_name;
  char *node_comp_name;
  mpc_ast_t *node_ast;
  int j;
  mpc_ast_t *signal_ast;
  int i;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff50;
  mpc_ast_t *in_stack_ffffffffffffff58;
  mpc_ast_t *in_stack_ffffffffffffff60;
  mpc_ast_t *in_stack_ffffffffffffff70;
  GenCADFile *in_stack_ffffffffffffff78;
  key_type *in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  
  while (iVar1 = mpc_ast_get_index_lb
                           (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                            in_stack_ffffffffffffff4c), -1 < iVar1) {
    mpc_ast_get_child_lb
              (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c
              );
    while (iVar1 = mpc_ast_get_index_lb
                             (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                              in_stack_ffffffffffffff4c), -1 < iVar1) {
      mpc_ast_get_child_lb
                (in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,
                 in_stack_ffffffffffffff4c);
      pcVar2 = get_nonquoted_or_quoted_string_child
                         (in_RDI,in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
      pcVar3 = get_nonquoted_or_quoted_string_child
                         (in_RDI,in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58);
      pmVar4 = (mpc_ast_t *)
               get_stringtoend_child
                         (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,(char *)in_RDI);
      if (((pcVar2 != (char *)0x0) && (pcVar3 != (char *)0x0)) && (pmVar4 != (mpc_ast_t *)0x0)) {
        in_stack_ffffffffffffff50 =
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&stack0xffffffffffffff80;
        std::
        tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::tuple<char_*&,_char_*&,_true>
                  (in_stack_ffffffffffffff50,
                   (char **)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (char **)0x18c5a7);
        in_stack_ffffffffffffff60 =
             (mpc_ast_t *)
             std::
             map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        std::__cxx11::string::operator=((string *)in_stack_ffffffffffffff60,(char *)pmVar4);
        std::
        tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x18c5e9);
        in_stack_ffffffffffffff58 = pmVar4;
      }
    }
  }
  return;
}

Assistant:

void GenCADFile::fill_signals_cache() {
	for (int i = 0;;) {
		i = mpc_ast_get_index_lb(signals_ast, "signal|>", i);
		if (i < 0) break;
		mpc_ast_t *signal_ast = mpc_ast_get_child_lb(signals_ast, "signal|>", i);
		for (int j = 0;;) {
			j = mpc_ast_get_index_lb(signal_ast, "node|>", j);
			if (j < 0) break;
			mpc_ast_t *node_ast           = mpc_ast_get_child_lb(signal_ast, "node|>", j);
			char *node_comp_name = get_nonquoted_or_quoted_string_child(node_ast, "component_name");
			char *node_pin_name = get_nonquoted_or_quoted_string_child(node_ast, "pin_name");
			char *signal_name = get_stringtoend_child(signal_ast, "sig_name_to_end");
			if (node_comp_name && node_pin_name && signal_name) {
				ComponentPin key{node_comp_name, node_pin_name};
				m_signals_cache[key] = signal_name;
			}
			j++;
		}
		i++;
	}
}